

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O1

void massagereaction(Item *qREACTION,Item *qREACT1,Item *qlpar,Item *qcomma,Item *qrpar)

{
  Reaction *pRVar1;
  Reaction *pRVar2;
  char *pcVar3;
  
  pRVar1 = reactlist;
  pRVar2 = (Reaction *)emalloc(0x30);
  reactlist = pRVar2;
  pRVar2->reactnext = pRVar1;
  pRVar2->rterm[1] = rterm;
  pRVar2->rterm[0] = lterm;
  pcVar3 = qconcat(qlpar->next,qcomma->prev);
  reactlist->krate[0] = pcVar3;
  pcVar3 = qconcat(qcomma->next,qrpar->prev);
  pRVar1 = reactlist;
  reactlist->krate[1] = pcVar3;
  pRVar1->position = qrpar;
  replacstr(qREACTION,"/* ~");
  insertstr(qrpar,")*/\n");
  replacstr(qrpar,"/*REACTION*/\n");
  rterm = (Rterm *)0x0;
  return;
}

Assistant:

void massagereaction(qREACTION, qREACT1, qlpar, qcomma, qrpar)
	Item *qREACTION, *qREACT1, *qlpar, *qcomma, *qrpar;
{
	Reaction *r1;
	
	/*ARGSUSED*/
	r1 = reactlist;
	reactlist = (Reaction *)emalloc(sizeof(Reaction));
	reactlist->reactnext = r1;
	reactlist->rterm[1] = rterm;
	reactlist->rterm[0] = lterm;
	reactlist->krate[0] = qconcat(qlpar->next, qcomma->prev);
	reactlist->krate[1] = qconcat(qcomma->next, qrpar->prev);
	reactlist->position = qrpar;
	/*SUPPRESS 440*/
	replacstr(qREACTION, "/* ~");
	/*SUPPRESS 440*/
	Insertstr(qrpar, ")*/\n");
	/*SUPPRESS 440*/
	replacstr(qrpar, "/*REACTION*/\n");
	rterm = (Rterm *)0;
}